

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpWithTcpClient::KcpWithTcpClient
          (KcpWithTcpClient *this,EventLoop *loop,InetAddress *tcpServerAddr,string *nameArg,
          int kcpMode)

{
  element_type *peVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  EventLoop *pEVar5;
  Connector *this_00;
  self *psVar6;
  EventLoop *in_R9;
  SourceFile file;
  SourceFile file_00;
  Logger local_1048;
  SourceFile local_78;
  undefined1 local_68 [12];
  _Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  local_58;
  MutexLock *local_40;
  int local_38;
  
  local_38 = kcpMode;
  Logger::SourceFile::SourceFile<107>
            (&local_78,
             (char (*) [107])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
            );
  file.m_data = (char *)(ulong)(uint)local_78.m_size;
  file._8_8_ = 0x29;
  pEVar5 = CheckNotNull<sznet::net::EventLoop>
                     ((sznet *)local_78.m_data,file,0x14680d,(char *)loop,in_R9);
  this->m_loop = pEVar5;
  this_00 = (Connector *)operator_new(0x70);
  Connector::Connector(this_00,loop,tcpServerAddr);
  std::__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::Connector,void>
            ((__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2> *)&this->m_tcpConnector
             ,this_00);
  std::__cxx11::string::string((string *)&this->m_name,(string *)nameArg);
  *(undefined8 *)((long)&(this->m_kcpConnectionCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_kcpConnectionCallback).super__Function_base._M_functor =
       defaultKcpConnectionCallback;
  (this->m_kcpConnectionCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&)>
       ::_M_invoke;
  (this->m_kcpConnectionCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&)>
       ::_M_manager;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_kcpMessageCallback).super__Function_base._M_functor =
       defaultKcpMessageCallback;
  (this->m_kcpMessageCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_invoke;
  (this->m_kcpMessageCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_manager;
  *(undefined8 *)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpWriteCompleteCallback).super__Function_base._M_functor + 8) = 0
  ;
  (this->m_kcpWriteCompleteCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpWriteCompleteCallback)._M_invoker = (_Invoker_type)0x0;
  this->m_tcpRetry = (__atomic_base<bool>)0x0;
  this->m_tcpConnect = (__atomic_base<bool>)0x1;
  this->m_nextConnId = 1;
  MutexLock::MutexLock(&this->m_mutex);
  (this->m_tcpConnection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_tcpConnection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58._M_f = (offset_in_KcpWithTcpClient_to_subr)handleTcpMessage;
  local_58._8_8_ = 0;
  local_58._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_sznet::net::KcpWithTcpClient_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  local_40 = &this->m_mutex;
  std::
  function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
  ::
  function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>,void>
            ((function<void(std::shared_ptr<sznet::net::TcpConnection>const&,std::__cxx11::string_const&,sznet::Timestamp)>
              *)&local_1048,&local_58);
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  ::function(&(this->m_tcpCodec).m_messageCallback,
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
              *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  uVar2 = *(undefined8 *)&tcpServerAddr->field_0;
  uVar3 = *(undefined8 *)((long)&tcpServerAddr->field_0 + 8);
  uVar4 = *(undefined8 *)((long)&tcpServerAddr->field_0 + 0x14);
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0xc) =
       *(undefined8 *)((long)&tcpServerAddr->field_0 + 0xc);
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0x14) = uVar4;
  *(undefined8 *)&(this->m_udpListenAddr).field_0 = uVar2;
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 8) = uVar3;
  (this->m_kcpConnection).super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x20);
  this->m_kcpMode = local_38;
  peVar1 = (this->m_tcpConnector).
           super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_58._M_f = (offset_in_KcpWithTcpClient_to_subr)newTcpConnection;
  local_58._8_8_ = 0;
  local_58._M_bound_args.
  super__Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
  .super__Head_base<0UL,_sznet::net::KcpWithTcpClient_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
        )(_Tuple_impl<0UL,_sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>_>
          )this;
  std::function<void(int)>::
  function<std::_Bind<void(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient*,std::_Placeholder<1>))(int)>,void>
            ((function<void(int)> *)&local_1048,
             (_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(int)>
              *)&local_58);
  std::function<void_(int)>::operator=
            (&peVar1->m_newConnectionCallback,(function<void_(int)> *)&local_1048);
  std::_Function_base::~_Function_base((_Function_base *)&local_1048);
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_68,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpClient.cpp"
              );
    file_00._12_4_ = 0;
    file_00.m_data = (char *)local_68._0_8_;
    file_00.m_size = local_68._8_4_;
    Logger::Logger(&local_1048,file_00,0x37);
    psVar6 = LogStream::operator<<
                       (&local_1048.m_impl.m_stream,"KcpWithTcpClient::KcpWithTcpClient[");
    psVar6 = LogStream::operator<<(psVar6,&this->m_name);
    psVar6 = LogStream::operator<<(psVar6,"] - tcp connector ");
    LogStream::operator<<
              (psVar6,(this->m_tcpConnector).
                      super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger(&local_1048);
  }
  return;
}

Assistant:

KcpWithTcpClient::KcpWithTcpClient(EventLoop* loop, const InetAddress& tcpServerAddr, const string& nameArg, int kcpMode):
	m_loop(CHECK_NOTNULL(loop)),
	m_tcpConnector(new Connector(loop, tcpServerAddr)),
    m_name(nameArg),
    m_kcpConnectionCallback(defaultKcpConnectionCallback),
    m_kcpMessageCallback(defaultKcpMessageCallback),
    m_tcpRetry(false),
    m_tcpConnect(true),
    m_nextConnId(1),
	m_tcpCodec(std::bind(&KcpWithTcpClient::handleTcpMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
	m_udpListenAddr(tcpServerAddr),
	m_kcpMode(kcpMode)
{
	m_tcpConnector->setNewConnectionCallback(std::bind(&KcpWithTcpClient::newTcpConnection, this, std::placeholders::_1));
	// FIXME setConnectFailedCallback
	LOG_INFO << "KcpWithTcpClient::KcpWithTcpClient[" << m_name 
		<< "] - tcp connector " << get_pointer(m_tcpConnector);
}